

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O2

int nn_sock_recv(nn_sock *self,nn_msg *msg,int flags)

{
  FILE *__stream;
  int iVar1;
  uint errnum;
  int iVar2;
  uint64_t uVar3;
  char *pcVar4;
  ulong uVar5;
  nn_ctx *self_00;
  long lVar6;
  
  if ((self->socktype->flags & 1) == 0) {
    self_00 = &self->ctx;
    nn_ctx_enter(self_00);
    if (self->rcvtimeo < 0) {
      lVar6 = -1;
      uVar5 = 0xffffffffffffffff;
    }
    else {
      uVar3 = nn_clock_ms();
      lVar6 = (long)self->rcvtimeo;
      uVar5 = uVar3 + lVar6;
    }
    while (iVar2 = -9, 2 < self->state - 3U) {
      iVar1 = (*self->sockbase->vfptr->recv)(self->sockbase,msg);
      iVar2 = 0;
      if (iVar1 == 0) break;
      if (-1 < iVar1) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/sock.c"
                ,0x2c1);
LAB_00117811:
        fflush(_stderr);
        nn_err_abort();
      }
      nn_ctx_leave(self_00);
      if (iVar1 != -0xb || (flags & 1U) != 0) {
        return iVar1;
      }
      errnum = nn_efd_wait(&self->rcvfd,(int)lVar6);
      if (errnum != 0) {
        if (errnum == 0xffffff92) {
          return -0x6e;
        }
        if (errnum == 0xfffffffc) {
          return -4;
        }
        if (errnum == 0xfffffff7) {
          return -9;
        }
        nn_backtrace_print();
        __stream = _stderr;
        pcVar4 = nn_err_strerror(errnum);
        fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar4,(ulong)errnum,
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/sock.c"
                ,0x2da);
        goto LAB_00117811;
      }
      nn_ctx_enter(self_00);
      iVar2 = nn_efd_wait(&self->rcvfd,0);
      if (iVar2 == 0) {
        *(byte *)&self->flags = (byte)self->flags | 1;
      }
      if (-1 < self->rcvtimeo) {
        uVar3 = nn_clock_ms();
        lVar6 = 0;
        if (uVar3 <= uVar5) {
          lVar6 = uVar5 - uVar3;
        }
      }
    }
    nn_ctx_leave(self_00);
  }
  else {
    iVar2 = -0x5f;
  }
  return iVar2;
}

Assistant:

int nn_sock_recv (struct nn_sock *self, struct nn_msg *msg, int flags)
{
    int rc;
    uint64_t deadline;
    uint64_t now;
    int timeout;

    /*  Some sockets types cannot be used for receiving messages. */
    if (nn_slow (self->socktype->flags & NN_SOCKTYPE_FLAG_NORECV))
        return -ENOTSUP;

    nn_ctx_enter (&self->ctx);

    /*  Compute the deadline for RCVTIMEO timer. */
    if (self->rcvtimeo < 0) {
        deadline = -1;
        timeout = -1;
    }
    else {
        deadline = nn_clock_ms() + self->rcvtimeo;
        timeout = self->rcvtimeo;
    }

    while (1) {

        switch (self->state) {
        case NN_SOCK_STATE_ACTIVE:
        case NN_SOCK_STATE_INIT:
             break;

        case NN_SOCK_STATE_STOPPING_EPS:
        case NN_SOCK_STATE_STOPPING:
        case NN_SOCK_STATE_FINI:
            /*  Socket closed or closing.  Should we return something
                else here; recvmsg(2) for example returns no data in
                this case, like read(2).  The use of indexed file
                descriptors is further problematic, as an FD can be reused
                leading to situations where technically the outstanding
                operation should refer to some other socket entirely.  */
            nn_ctx_leave (&self->ctx);
            return -EBADF;
        }

        /*  Try to receive the message in a non-blocking way. */
        rc = self->sockbase->vfptr->recv (self->sockbase, msg);
        if (nn_fast (rc == 0)) {
            nn_ctx_leave (&self->ctx);
            return 0;
        }
        nn_assert (rc < 0);

        /*  Any unexpected error is forwarded to the caller. */
        if (nn_slow (rc != -EAGAIN)) {
            nn_ctx_leave (&self->ctx);
            return rc;
        }

        /*  If the message cannot be received at the moment and the recv call
            is non-blocking, return immediately. */
        if (nn_fast (flags & NN_DONTWAIT)) {
            nn_ctx_leave (&self->ctx);
            return -EAGAIN;
        }

        /*  With blocking recv, wait while there are new pipes available
            for receiving. */
        nn_ctx_leave (&self->ctx);
        rc = nn_efd_wait (&self->rcvfd, timeout);
        if (nn_slow (rc == -ETIMEDOUT))
            return -ETIMEDOUT;
        if (nn_slow (rc == -EINTR))
            return -EINTR;
        if (nn_slow (rc == -EBADF))
            return -EBADF;
        errnum_assert (rc == 0, rc);
        nn_ctx_enter (&self->ctx);
        /*
         *  Double check if pipes are still available for receiving
         */
        if (!nn_efd_wait (&self->rcvfd, 0)) {
            self->flags |= NN_SOCK_FLAG_IN;
        }

        /*  If needed, re-compute the timeout to reflect the time that have
            already elapsed. */
        if (self->rcvtimeo >= 0) {
            now = nn_clock_ms();
            timeout = (int) (now > deadline ? 0 : deadline - now);
        }
    }
}